

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetPitch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  void *pvVar1;
  bool bVar2;
  AActor *pAVar3;
  char *pcVar4;
  uint uVar5;
  DAngle local_30;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e89fc;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e89ec:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e89fc:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1275,
                  "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003e893e;
    bVar2 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e89fc;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003e89ec;
LAB_003e893e:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_003e8a24:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1276,
                  "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003e8a24;
  }
  pvVar1 = param[1].field_0.field_1.a;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003e8a4c;
    }
    uVar5 = param[2].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
LAB_003e8a4c:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1277,
                    "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar5 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003e89a8;
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e8a6b;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003e89a8:
    pAVar3 = COPY_AAPTR(pAVar3,param[3].field_0.i);
    if (pAVar3 != (AActor *)0x0) {
      local_30.Degrees = (double)pvVar1;
      AActor::SetPitch(pAVar3,&local_30,SUB41((uVar5 & 2) >> 1,0),(bool)((byte)uVar5 & 1));
    }
    return 0;
  }
  pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e8a6b:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1278,
                "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetPitch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(pitch);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref != NULL)
	{
		ref->SetPitch(pitch, !!(flags & SPF_INTERPOLATE), !!(flags & SPF_FORCECLAMP));
	}
	return 0;
}